

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void mergesort_cache_lcp_2way<unsigned_char>(uchar **strings,size_t n)

{
  MergeResult MVar1;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output;
  uchar **strings_output;
  uchar *cache_input;
  uchar *cache_output;
  MergeResult m;
  uchar *cache_tmp;
  uchar *cache;
  uchar **input_tmp;
  lcp_t *lcp_tmp;
  lcp_t *lcp_input;
  size_t n_local;
  uchar **strings_local;
  
  lcp_input_00 = (lcp_t *)malloc(n << 3);
  lcp_output = (lcp_t *)malloc(n << 3);
  strings_output = (uchar **)malloc(n << 3);
  cache_input = (uchar *)malloc(n);
  cache_output = (uchar *)malloc(n);
  MVar1 = mergesort_cache_lcp_2way<false,unsigned_char>
                    (strings,strings_output,lcp_input_00,lcp_output,cache_input,cache_output,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,n << 3);
  }
  free(lcp_input_00);
  free(lcp_output);
  free(strings_output);
  free(cache_input);
  free(cache_output);
  stat_print();
  return;
}

Assistant:

static void
mergesort_cache_lcp_2way(unsigned char** strings, size_t n)
{
	lcp_t* lcp_input = (lcp_t*) malloc(n*sizeof(lcp_t));
	lcp_t* lcp_tmp   = (lcp_t*) malloc(n*sizeof(lcp_t));
	unsigned char** input_tmp = (unsigned char**) malloc(n*sizeof(unsigned char*));
	CharT* cache     = (CharT*) malloc(n*sizeof(CharT));
	CharT* cache_tmp = (CharT*) malloc(n*sizeof(CharT));
	MergeResult m = mergesort_cache_lcp_2way<false>(strings, input_tmp,
			lcp_input, lcp_tmp, cache, cache_tmp, n);
	if (m == SortedInTemp) {
		memcpy(strings, input_tmp, n*sizeof(unsigned char*));
	}
	free(lcp_input);
	free(lcp_tmp);
	free(input_tmp);
	free(cache);
	free(cache_tmp);
	stat_print();
}